

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json_parser<char,_std::allocator<char>_>::end_object
          (basic_json_parser<char,_std::allocator<char>_> *this,basic_json_visitor<char> *visitor,
          error_code *ec)

{
  parse_state pVar1;
  undefined8 in_RDX;
  function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> *in_RSI;
  basic_json_visitor<char> *in_RDI;
  ser_context *in_stack_ffffffffffffffd8;
  json_errc __args;
  
  __args = (json_errc)((ulong)in_RDX >> 0x20);
  if (*(int *)&in_RDI[6]._vptr_basic_json_visitor < 1) {
    std::function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)>::operator()
              (in_RSI,__args,(ser_context *)in_RDI);
    std::error_code::operator=((error_code *)in_RSI,__args);
    *(undefined1 *)((long)&in_RDI[0xf]._vptr_basic_json_visitor + 3) = 0;
  }
  else {
    pVar1 = pop_state(this);
    *(parse_state *)&in_RDI[0xf]._vptr_basic_json_visitor = pVar1;
    if (*(char *)&in_RDI[0xf]._vptr_basic_json_visitor == '\b') {
      basic_json_visitor<char>::end_object(in_RDI,in_stack_ffffffffffffffd8,(error_code *)0x1dc49f);
      *(byte *)((long)&in_RDI[0xf]._vptr_basic_json_visitor + 3) =
           (*(byte *)((long)&in_RDI[0xf]._vptr_basic_json_visitor + 5) ^ 0xff) & 1;
      if (*(int *)&in_RDI[6]._vptr_basic_json_visitor ==
          *(int *)&in_RDI[0x10]._vptr_basic_json_visitor) {
        *(undefined1 *)((long)&in_RDI[0xf]._vptr_basic_json_visitor + 3) = 0;
      }
      *(int *)&in_RDI[6]._vptr_basic_json_visitor = *(int *)&in_RDI[6]._vptr_basic_json_visitor + -1
      ;
      if (*(int *)&in_RDI[6]._vptr_basic_json_visitor == 0) {
        *(undefined1 *)&in_RDI[0xf]._vptr_basic_json_visitor = 2;
      }
      else {
        *(undefined1 *)&in_RDI[0xf]._vptr_basic_json_visitor = 7;
      }
    }
    else if (*(char *)&in_RDI[0xf]._vptr_basic_json_visitor == '\x0e') {
      std::function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)>::operator()
                (in_RSI,__args,(ser_context *)in_RDI);
      std::error_code::operator=((error_code *)in_RSI,__args);
      *(undefined1 *)((long)&in_RDI[0xf]._vptr_basic_json_visitor + 3) = 0;
    }
    else {
      std::function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)>::operator()
                (in_RSI,__args,(ser_context *)in_RDI);
      std::error_code::operator=((error_code *)in_RSI,__args);
      *(undefined1 *)((long)&in_RDI[0xf]._vptr_basic_json_visitor + 3) = 0;
    }
  }
  return;
}

Assistant:

void end_object(basic_json_visitor<char_type>& visitor, std::error_code& ec)
    {
        if (JSONCONS_UNLIKELY(level_ < 1))
        {
            err_handler_(json_errc::unexpected_rbrace, *this);
            ec = json_errc::unexpected_rbrace;
            more_ = false;
            return;
        }
        state_ = pop_state();
        if (state_ == parse_state::object)
        {
            visitor.end_object(*this, ec);
        }
        else if (state_ == parse_state::array)
        {
            err_handler_(json_errc::expected_comma_or_rbracket, *this);
            ec = json_errc::expected_comma_or_rbracket;
            more_ = false;
            return;
        }
        else
        {
            err_handler_(json_errc::unexpected_rbrace, *this);
            ec = json_errc::unexpected_rbrace;
            more_ = false;
            return;
        }

        more_ = !cursor_mode_;
        if (level_ == mark_level_)
        {
            more_ = false;
        }
        --level_;
        if (level_ == 0)
        {
            state_ = parse_state::accept;
        }
        else
        {
            state_ = parse_state::expect_comma_or_end;
        }
    }